

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O2

_Bool file_stdio_fflush(ALLEGRO_FILE *f)

{
  int errnum;
  int iVar1;
  USERDATA *pUVar2;
  int *piVar3;
  
  pUVar2 = get_userdata(f);
  iVar1 = fflush((FILE *)pUVar2->fp);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    errnum = *piVar3;
    pUVar2->errnum = errnum;
    al_set_errno(errnum);
  }
  return iVar1 != -1;
}

Assistant:

static bool file_stdio_fflush(ALLEGRO_FILE *f)
{
   USERDATA *userdata = get_userdata(f);

   if (fflush(userdata->fp) == EOF) {
      userdata->errnum = errno;
      al_set_errno(errno);
      return false;
   }

   return true;
}